

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

int __thiscall
Imf_3_2::DwaCompressor::compress
          (DwaCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  char cVar1;
  int maxY;
  CompressorScheme CVar2;
  pointer pCVar3;
  pointer ppcVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  undefined8 uVar10;
  BaseExc *pBVar11;
  InputExc *this_00;
  size_type *psVar12;
  size_t sVar13;
  pointer pCVar14;
  ushort v;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  size_t i;
  pointer pCVar18;
  undefined1 *toNonlinear;
  long lVar19;
  char *pcVar20;
  int byte;
  int y;
  int iVar21;
  bool bVar22;
  reference rVar23;
  char *local_358;
  char *local_350;
  char *local_348;
  char *inDataPtr;
  char *local_320;
  size_t outBufferSize;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  rowPtrs;
  vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
  channelRules;
  vector<bool,_std::allocator<bool>_> encodedChannels;
  char *writePtr;
  int local_290;
  int local_28c;
  
  inDataPtr = inPtr;
  local_320 = inPtr;
  initializeDefaultChannelRules(this);
  outBufferSize = 0;
  initializeBuffers(this,&outBufferSize);
  channelRules.
  super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  channelRules.
  super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  channelRules.
  super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  relevantChannelRules(this,&channelRules);
  lVar8 = ((long)channelRules.
                 super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)channelRules.
                super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x30;
  psVar12 = &((channelRules.
               super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
               ._M_impl.super__Vector_impl_data._M_start)->_suffix)._M_string_length;
  v = 2;
  while (bVar22 = lVar8 != 0, lVar8 = lVar8 + -1, bVar22) {
    v = v + (short)*psVar12 + 3;
    psVar12 = psVar12 + 6;
  }
  uVar16 = outBufferSize + v;
  outBufferSize = uVar16;
  if (this->_outBufferSize < uVar16) {
    this->_outBufferSize = uVar16;
    if (this->_outBuffer != (char *)0x0) {
      operator_delete__(this->_outBuffer);
    }
    pcVar9 = (char *)operator_new__(uVar16);
    this->_outBuffer = pcVar9;
  }
  else {
    pcVar9 = this->_outBuffer;
  }
  local_348 = this->_packedAcBuffer;
  local_350 = this->_packedDcBuffer;
  uVar15 = (range->max).x;
  if (this->_max[0] < (int)uVar15) {
    uVar15 = this->_max[0];
  }
  sVar13 = (size_t)uVar15;
  iVar6 = (range->min).x;
  iVar21 = (range->min).y;
  maxY = (range->max).y;
  if (this->_max[1] < maxY) {
    maxY = this->_max[1];
  }
  pcVar9[0x48] = '\0';
  pcVar9[0x49] = '\0';
  pcVar9[0x4a] = '\0';
  pcVar9[0x4b] = '\0';
  pcVar9[0x4c] = '\0';
  pcVar9[0x4d] = '\0';
  pcVar9[0x4e] = '\0';
  pcVar9[0x4f] = '\0';
  pcVar9[0x50] = '\0';
  pcVar9[0x51] = '\0';
  pcVar9[0x52] = '\0';
  pcVar9[0x53] = '\0';
  pcVar9[0x54] = '\0';
  pcVar9[0x55] = '\0';
  pcVar9[0x56] = '\0';
  pcVar9[0x57] = '\0';
  pcVar9[0x38] = '\0';
  pcVar9[0x39] = '\0';
  pcVar9[0x3a] = '\0';
  pcVar9[0x3b] = '\0';
  pcVar9[0x3c] = '\0';
  pcVar9[0x3d] = '\0';
  pcVar9[0x3e] = '\0';
  pcVar9[0x3f] = '\0';
  pcVar9[0x40] = '\0';
  pcVar9[0x41] = '\0';
  pcVar9[0x42] = '\0';
  pcVar9[0x43] = '\0';
  pcVar9[0x44] = '\0';
  pcVar9[0x45] = '\0';
  pcVar9[0x46] = '\0';
  pcVar9[0x47] = '\0';
  pcVar9[0x28] = '\0';
  pcVar9[0x29] = '\0';
  pcVar9[0x2a] = '\0';
  pcVar9[0x2b] = '\0';
  pcVar9[0x2c] = '\0';
  pcVar9[0x2d] = '\0';
  pcVar9[0x2e] = '\0';
  pcVar9[0x2f] = '\0';
  pcVar9[0x30] = '\0';
  pcVar9[0x31] = '\0';
  pcVar9[0x32] = '\0';
  pcVar9[0x33] = '\0';
  pcVar9[0x34] = '\0';
  pcVar9[0x35] = '\0';
  pcVar9[0x36] = '\0';
  pcVar9[0x37] = '\0';
  pcVar9[0x18] = '\0';
  pcVar9[0x19] = '\0';
  pcVar9[0x1a] = '\0';
  pcVar9[0x1b] = '\0';
  pcVar9[0x1c] = '\0';
  pcVar9[0x1d] = '\0';
  pcVar9[0x1e] = '\0';
  pcVar9[0x1f] = '\0';
  pcVar9[0x20] = '\0';
  pcVar9[0x21] = '\0';
  pcVar9[0x22] = '\0';
  pcVar9[0x23] = '\0';
  pcVar9[0x24] = '\0';
  pcVar9[0x25] = '\0';
  pcVar9[0x26] = '\0';
  pcVar9[0x27] = '\0';
  pcVar9[8] = '\0';
  pcVar9[9] = '\0';
  pcVar9[10] = '\0';
  pcVar9[0xb] = '\0';
  pcVar9[0xc] = '\0';
  pcVar9[0xd] = '\0';
  pcVar9[0xe] = '\0';
  pcVar9[0xf] = '\0';
  pcVar9[0x10] = '\0';
  pcVar9[0x11] = '\0';
  pcVar9[0x12] = '\0';
  pcVar9[0x13] = '\0';
  pcVar9[0x14] = '\0';
  pcVar9[0x15] = '\0';
  pcVar9[0x16] = '\0';
  pcVar9[0x17] = '\0';
  pcVar9[0] = '\x02';
  pcVar9[1] = '\0';
  pcVar9[2] = '\0';
  pcVar9[3] = '\0';
  pcVar9[4] = '\0';
  pcVar9[5] = '\0';
  pcVar9[6] = '\0';
  pcVar9[7] = '\0';
  *(ulong *)(pcVar9 + 0x50) = (ulong)this->_acCompression;
  setupChannelData(this,iVar6,iVar21,uVar15,maxY);
  local_358 = pcVar9 + (ulong)v + 0x58;
  writePtr = this->_outBuffer + 0x58;
  Xdr::write<Imf_3_2::CharPtrIO,char*>(&writePtr,v);
  lVar8 = 0;
  for (uVar16 = 0;
      uVar16 < (ulong)(((long)channelRules.
                              super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)channelRules.
                             super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x30); uVar16 = uVar16 + 1
      ) {
    Classifier::write((Classifier *)
                      ((long)&((channelRules.
                                super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_suffix)._M_dataplus.
                              _M_p + lVar8),(int)&writePtr,
                      (void *)(((long)channelRules.
                                      super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)channelRules.
                                     super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                                     ._M_impl.super__Vector_impl_data._M_start) % 0x30),sVar13);
    lVar8 = lVar8 + 0x30;
  }
  std::vector<bool,_std::allocator<bool>_>::vector
            (&encodedChannels,
             ((long)(this->_channelData).
                    super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->_channelData).
                   super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x98,(allocator_type *)&writePtr);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::vector(&rowPtrs,((long)(this->_channelData).
                           super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_channelData).
                          super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x98,
           (allocator_type *)&writePtr);
  uVar15 = 0;
  while( true ) {
    pCVar18 = (this->_channelData).
              super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar14 = (this->_channelData).
              super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pCVar14 - (long)pCVar18) / 0x98) <= (ulong)uVar15) break;
    rVar23 = std::vector<bool,_std::allocator<bool>_>::operator[](&encodedChannels,(ulong)uVar15);
    *rVar23._M_p = *rVar23._M_p & ~rVar23._M_mask;
    uVar15 = uVar15 + 1;
  }
  inDataPtr = local_320;
  for (; iVar21 <= maxY; iVar21 = iVar21 + 1) {
    for (uVar15 = 0; uVar16 = (ulong)uVar15,
        uVar16 < (ulong)(((long)pCVar14 - (long)pCVar18) / 0x98); uVar15 = uVar15 + 1) {
      iVar6 = Imath_3_2::modp(iVar21,pCVar18[uVar16].ySampling);
      if (iVar6 == 0) {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  (rowPtrs.
                   super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar16,&inDataPtr);
        iVar6 = pCVar18[uVar16].width;
        iVar7 = pixelTypeSize(pCVar18[uVar16].type);
        inDataPtr = inDataPtr + (long)iVar7 * (long)iVar6;
      }
      pCVar18 = (this->_channelData).
                super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar14 = (this->_channelData).
                super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  inDataPtr = local_320;
  uVar15 = 0;
  while( true ) {
    uVar16 = (ulong)uVar15;
    pCVar3 = (this->_cscSets).
             super__Vector_base<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_cscSets).
                       super__Vector_base<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) / 0xc) <= uVar16)
    break;
    iVar6 = pCVar3[uVar16].idx[0];
    pCVar18 = (this->_channelData).
              super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    LossyDctEncoderCsc::LossyDctEncoderCsc
              ((LossyDctEncoderCsc *)&writePtr,this->_dwaCompressionLevel / 100000.0,
               rowPtrs.
               super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar6,
               rowPtrs.
               super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + pCVar3[uVar16].idx[1],
               rowPtrs.
               super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + pCVar3[uVar16].idx[2],local_348,local_350
               ,(unsigned_short *)dwaCompressorToNonlinear,pCVar18[iVar6].width,
               pCVar18[iVar6].height,pCVar18[iVar6].type,pCVar18[pCVar3[uVar16].idx[1]].type,
               pCVar18[pCVar3[uVar16].idx[2]].type);
    LossyDctEncoderBase::execute((LossyDctEncoderBase *)&writePtr);
    lVar19 = (long)local_290;
    *(long *)(pcVar9 + 0x40) = *(long *)(pcVar9 + 0x40) + lVar19;
    lVar8 = (long)local_28c;
    *(long *)(pcVar9 + 0x48) = *(long *)(pcVar9 + 0x48) + lVar8;
    rVar23 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&encodedChannels,
                        (long)(this->_cscSets).
                              super__Vector_base<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16].idx[0]);
    *rVar23._M_p = *rVar23._M_p | rVar23._M_mask;
    rVar23 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&encodedChannels,
                        (long)(this->_cscSets).
                              super__Vector_base<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16].idx[1]);
    *rVar23._M_p = *rVar23._M_p | rVar23._M_mask;
    rVar23 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&encodedChannels,
                        (long)(this->_cscSets).
                              super__Vector_base<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16].idx[2]);
    local_348 = local_348 + lVar19 * 2;
    local_350 = local_350 + lVar8 * 2;
    *rVar23._M_p = *rVar23._M_p | rVar23._M_mask;
    LossyDctEncoderBase::~LossyDctEncoderBase((LossyDctEncoderBase *)&writePtr);
    uVar15 = uVar15 + 1;
  }
  uVar15 = 0;
  while( true ) {
    uVar16 = (ulong)uVar15;
    pCVar18 = (this->_channelData).
              super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_channelData).
                       super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar18) / 0x98) <= uVar16
       ) break;
    rVar23 = std::vector<bool,_std::allocator<bool>_>::operator[](&encodedChannels,uVar16);
    if ((*rVar23._M_p & rVar23._M_mask) == 0) {
      CVar2 = pCVar18[uVar16].compression;
      if (CVar2 == UNKNOWN) {
        iVar6 = pCVar18[uVar16].width;
        iVar21 = pixelTypeSize(pCVar18[uVar16].type);
        sVar13 = (long)iVar21 * (long)iVar6;
        uVar17 = 0;
        while( true ) {
          ppcVar4 = rowPtrs.
                    super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar16].
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)rowPtrs.
                            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar16].
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppcVar4 >> 3) <= (ulong)uVar17
             ) break;
          memcpy(pCVar18[uVar16].planarUncBufferEnd,ppcVar4[uVar17],sVar13);
          pCVar18[uVar16].planarUncBufferEnd = pCVar18[uVar16].planarUncBufferEnd + sVar13;
          uVar17 = uVar17 + 1;
        }
        *(long *)(pcVar9 + 8) = *(long *)(pcVar9 + 8) + (long)pCVar18[uVar16].planarUncSize;
      }
      else if (CVar2 == LOSSY_DCT) {
        toNonlinear = dwaCompressorToNonlinear;
        if (pCVar18[uVar16].pLinear != false) {
          toNonlinear = (undefined1 *)0x0;
        }
        LossyDctEncoder::LossyDctEncoder
                  ((LossyDctEncoder *)&writePtr,this->_dwaCompressionLevel / 100000.0,
                   rowPtrs.
                   super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar16,local_348,local_350,
                   (unsigned_short *)toNonlinear,pCVar18[uVar16].width,pCVar18[uVar16].height,
                   pCVar18[uVar16].type);
        LossyDctEncoderBase::execute((LossyDctEncoderBase *)&writePtr);
        *(long *)(pcVar9 + 0x40) = *(long *)(pcVar9 + 0x40) + (long)local_290;
        *(long *)(pcVar9 + 0x48) = *(long *)(pcVar9 + 0x48) + (long)local_28c;
        local_348 = local_348 + (long)local_290 * 2;
        local_350 = local_350 + (long)local_28c * 2;
        LossyDctEncoderBase::~LossyDctEncoderBase((LossyDctEncoderBase *)&writePtr);
      }
      else if (CVar2 == RLE) {
        uVar17 = 0;
        while( true ) {
          ppcVar4 = rowPtrs.
                    super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar16].
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)rowPtrs.
                            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar16].
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppcVar4 >> 3) <= (ulong)uVar17
             ) break;
          pcVar20 = ppcVar4[uVar17];
          for (iVar6 = 0; iVar21 = pCVar18[uVar16].width, iVar6 < iVar21; iVar6 = iVar6 + 1) {
            for (lVar8 = 0; iVar21 = pixelTypeSize(pCVar18[uVar16].type), lVar8 < iVar21;
                lVar8 = lVar8 + 1) {
              cVar1 = pcVar20[lVar8];
              pcVar5 = pCVar18[uVar16].planarUncRleEnd[lVar8];
              pCVar18[uVar16].planarUncRleEnd[lVar8] = pcVar5 + 1;
              *pcVar5 = cVar1;
            }
            pcVar20 = pcVar20 + lVar8;
          }
          iVar6 = pixelTypeSize(pCVar18[uVar16].type);
          *(long *)(pcVar9 + 0x38) = *(long *)(pcVar9 + 0x38) + (long)(iVar6 * iVar21);
          uVar17 = uVar17 + 1;
        }
      }
      rVar23 = std::vector<bool,_std::allocator<bool>_>::operator[](&encodedChannels,uVar16);
      *rVar23._M_p = *rVar23._M_p | rVar23._M_mask;
    }
    uVar15 = uVar15 + 1;
  }
  lVar8 = *(long *)(pcVar9 + 8);
  if (lVar8 != 0) {
    pcVar20 = this->_planarUncBuffer[0];
    uVar10 = exr_compress_max_buffer_size(lVar8);
    iVar6 = exr_compress_buffer(9,pcVar20,lVar8,local_358,uVar10,&writePtr);
    if (iVar6 != 0) {
      pBVar11 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::BaseExc::BaseExc(pBVar11,"Data compression (zlib) failed.");
      __cxa_throw(pBVar11,&Iex_3_2::BaseExc::typeinfo,Iex_3_2::BaseExc::~BaseExc);
    }
    local_358 = local_358 + (long)writePtr;
    *(char **)(pcVar9 + 0x10) = writePtr;
  }
  lVar8 = *(long *)(pcVar9 + 0x40);
  if (lVar8 == 0) goto LAB_00174a7d;
  if (this->_acCompression == STATIC_HUFFMAN) {
    iVar6 = hufCompress((unsigned_short *)this->_packedAcBuffer,(int)lVar8,local_358);
    pcVar20 = (char *)(long)iVar6;
LAB_00174a6d:
    *(char **)(pcVar9 + 0x18) = pcVar20;
  }
  else {
    if (this->_acCompression == DEFLATE) {
      pcVar20 = this->_packedAcBuffer;
      uVar10 = exr_compress_max_buffer_size(lVar8 * 2);
      iVar6 = exr_compress_buffer(9,pcVar20,lVar8 * 2,local_358,uVar10,&writePtr);
      pcVar20 = writePtr;
      if (iVar6 != 0) {
        this_00 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::InputExc::InputExc(this_00,"Data compression (zlib) failed.");
        __cxa_throw(this_00,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
      }
      goto LAB_00174a6d;
    }
    pcVar20 = *(char **)(pcVar9 + 0x18);
  }
  local_358 = local_358 + (long)pcVar20;
LAB_00174a7d:
  if (*(long *)(pcVar9 + 0x48) != 0) {
    iVar6 = Zip::compress(this->_zip,this->_packedDcBuffer,(int)*(long *)(pcVar9 + 0x48) * 2,
                          local_358);
    *(long *)(pcVar9 + 0x20) = (long)iVar6;
    local_358 = local_358 + iVar6;
  }
  if (*(long *)(pcVar9 + 0x38) != 0) {
    iVar6 = rleCompress((int)*(long *)(pcVar9 + 0x38),this->_planarUncBuffer[2],this->_rleBuffer);
    lVar8 = (long)iVar6;
    *(long *)(pcVar9 + 0x30) = lVar8;
    pcVar20 = this->_rleBuffer;
    uVar10 = exr_compress_max_buffer_size(lVar8);
    iVar6 = exr_compress_buffer(9,pcVar20,lVar8,local_358,uVar10,&writePtr);
    if (iVar6 != 0) {
      pBVar11 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::BaseExc::BaseExc(pBVar11,"Error compressing RLE\'d data.");
      __cxa_throw(pBVar11,&Iex_3_2::BaseExc::typeinfo,Iex_3_2::BaseExc::~BaseExc);
    }
    *(char **)(pcVar9 + 0x28) = writePtr;
    local_358 = local_358 + (long)writePtr;
  }
  for (lVar8 = 0; pcVar9 = this->_outBuffer, lVar8 != 0x58; lVar8 = lVar8 + 8) {
    writePtr = pcVar9 + lVar8;
    Xdr::write<Imf_3_2::CharPtrIO,char*>(&writePtr,*(uint64_t *)(pcVar9 + lVar8));
  }
  *outPtr = pcVar9;
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::~vector(&rowPtrs);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&encodedChannels.super__Bvector_base<std::allocator<bool>_>);
  std::
  vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>::
  ~vector(&channelRules);
  return (int)local_358 - (int)pcVar9;
}

Assistant:

int
DwaCompressor::compress (
    const char*            inPtr,
    int                    inSize,
    IMATH_NAMESPACE::Box2i range,
    const char*&           outPtr)
{
    const char* inDataPtr   = inPtr;
    char*       packedAcEnd = 0;
    char*       packedDcEnd = 0;
    int         fileVersion = 2; // Starting with 2, we write the channel
                                 // classification rules into the file

    if (fileVersion < 2)
        initializeLegacyChannelRules ();
    else
        initializeDefaultChannelRules ();

    size_t outBufferSize = 0;
    initializeBuffers (outBufferSize);

    unsigned short          channelRuleSize = 0;
    std::vector<Classifier> channelRules;
    if (fileVersion >= 2)
    {
        relevantChannelRules (channelRules);

        channelRuleSize = Xdr::size<unsigned short> ();
        for (size_t i = 0; i < channelRules.size (); ++i)
            channelRuleSize += channelRules[i].size ();
    }

    //
    // Remember to allocate _outBuffer, if we haven't done so already.
    //

    outBufferSize += channelRuleSize;
    if (outBufferSize > _outBufferSize)
    {
        _outBufferSize = outBufferSize;
        if (_outBuffer != 0) delete[] _outBuffer;
        _outBuffer = new char[outBufferSize];
    }

    char* outDataPtr =
        &_outBuffer[NUM_SIZES_SINGLE * sizeof (uint64_t) + channelRuleSize];

    //
    // We might not be dealing with any color data, in which
    // case the AC buffer size will be 0, and dereferencing
    // a vector will not be a good thing to do.
    //

    if (_packedAcBuffer) packedAcEnd = _packedAcBuffer;

    if (_packedDcBuffer) packedDcEnd = _packedDcBuffer;

#define OBIDX(x) (uint64_t*) &_outBuffer[x * sizeof (uint64_t)]

    uint64_t* version                 = OBIDX (VERSION);
    uint64_t* unknownUncompressedSize = OBIDX (UNKNOWN_UNCOMPRESSED_SIZE);
    uint64_t* unknownCompressedSize   = OBIDX (UNKNOWN_COMPRESSED_SIZE);
    uint64_t* acCompressedSize        = OBIDX (AC_COMPRESSED_SIZE);
    uint64_t* dcCompressedSize        = OBIDX (DC_COMPRESSED_SIZE);
    uint64_t* rleCompressedSize       = OBIDX (RLE_COMPRESSED_SIZE);
    uint64_t* rleUncompressedSize     = OBIDX (RLE_UNCOMPRESSED_SIZE);
    uint64_t* rleRawSize              = OBIDX (RLE_RAW_SIZE);

    uint64_t* totalAcUncompressedCount = OBIDX (AC_UNCOMPRESSED_COUNT);
    uint64_t* totalDcUncompressedCount = OBIDX (DC_UNCOMPRESSED_COUNT);

    uint64_t* acCompression = OBIDX (AC_COMPRESSION);

    int minX = range.min.x;
    int maxX = std::min (range.max.x, _max[0]);
    int minY = range.min.y;
    int maxY = std::min (range.max.y, _max[1]);

    //
    // Zero all the numbers in the chunk header
    //

    memset (_outBuffer, 0, NUM_SIZES_SINGLE * sizeof (uint64_t));

    //
    // Setup the AC compression strategy and the version in the data block,
    // then write the relevant channel classification rules if needed
    //
    *version       = fileVersion;
    *acCompression = _acCompression;

    setupChannelData (minX, minY, maxX, maxY);

    if (fileVersion >= 2)
    {
        char* writePtr = &_outBuffer[NUM_SIZES_SINGLE * sizeof (uint64_t)];
        Xdr::write<CharPtrIO> (writePtr, channelRuleSize);

        for (size_t i = 0; i < channelRules.size (); ++i)
            channelRules[i].write (writePtr);
    }

    //
    // Determine the start of each row in the input buffer
    // Channels are interleaved by scanline
    //

    std::vector<bool> encodedChannels (_channelData.size ());
    std::vector<std::vector<const char*>> rowPtrs (_channelData.size ());

    for (unsigned int chan = 0; chan < _channelData.size (); ++chan)
        encodedChannels[chan] = false;

    inDataPtr = inPtr;

    for (int y = minY; y <= maxY; ++y)
    {
        for (unsigned int chan = 0; chan < _channelData.size (); ++chan)
        {

            ChannelData* cd = &_channelData[chan];

            if (IMATH_NAMESPACE::modp (y, cd->ySampling) != 0) continue;

            rowPtrs[chan].push_back (inDataPtr);
            inDataPtr +=
                cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
        }
    }

    inDataPtr = inPtr;

    //
    // Make a pass over all our CSC sets and try to encode them first
    //

    for (unsigned int csc = 0; csc < _cscSets.size (); ++csc)
    {

        LossyDctEncoderCsc encoder (
            _dwaCompressionLevel / 100000.f,
            rowPtrs[_cscSets[csc].idx[0]],
            rowPtrs[_cscSets[csc].idx[1]],
            rowPtrs[_cscSets[csc].idx[2]],
            packedAcEnd,
            packedDcEnd,
            dwaCompressorToNonlinear,
            _channelData[_cscSets[csc].idx[0]].width,
            _channelData[_cscSets[csc].idx[0]].height,
            _channelData[_cscSets[csc].idx[0]].type,
            _channelData[_cscSets[csc].idx[1]].type,
            _channelData[_cscSets[csc].idx[2]].type);

        encoder.execute ();

        *totalAcUncompressedCount += encoder.numAcValuesEncoded ();
        *totalDcUncompressedCount += encoder.numDcValuesEncoded ();

        packedAcEnd += encoder.numAcValuesEncoded () * sizeof (unsigned short);
        packedDcEnd += encoder.numDcValuesEncoded () * sizeof (unsigned short);

        encodedChannels[_cscSets[csc].idx[0]] = true;
        encodedChannels[_cscSets[csc].idx[1]] = true;
        encodedChannels[_cscSets[csc].idx[2]] = true;
    }

    for (unsigned int chan = 0; chan < _channelData.size (); ++chan)
    {
        ChannelData* cd = &_channelData[chan];

        if (encodedChannels[chan]) continue;

        switch (cd->compression)
        {
            case LOSSY_DCT:

                //
                // For LOSSY_DCT, treat this just like the CSC'd case,
                // but only operate on one channel
                //

                {
                    const unsigned short* nonlinearLut = 0;

                    if (!cd->pLinear) nonlinearLut = dwaCompressorToNonlinear;

                    LossyDctEncoder encoder (
                        _dwaCompressionLevel / 100000.f,
                        rowPtrs[chan],
                        packedAcEnd,
                        packedDcEnd,
                        nonlinearLut,
                        cd->width,
                        cd->height,
                        cd->type);

                    encoder.execute ();

                    *totalAcUncompressedCount += encoder.numAcValuesEncoded ();
                    *totalDcUncompressedCount += encoder.numDcValuesEncoded ();

                    packedAcEnd +=
                        encoder.numAcValuesEncoded () * sizeof (unsigned short);

                    packedDcEnd +=
                        encoder.numDcValuesEncoded () * sizeof (unsigned short);
                }

                break;

            case RLE:

                //
                // For RLE, bash the bytes up so that the first bytes of each
                // pixel are contiguous, as are the second bytes, and so on.
                //

                for (unsigned int y = 0; y < rowPtrs[chan].size (); ++y)
                {
                    const char* row = rowPtrs[chan][y];

                    for (int x = 0; x < cd->width; ++x)
                    {
                        for (int byte = 0;
                             byte <
                             OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
                             ++byte)
                        {

                            *cd->planarUncRleEnd[byte]++ = *row++;
                        }
                    }

                    *rleRawSize +=
                        cd->width *
                        OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
                }

                break;

            case UNKNOWN:

                //
                // Otherwise, just copy data over verbatim
                //

                {
                    int scanlineSize =
                        cd->width *
                        OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);

                    for (unsigned int y = 0; y < rowPtrs[chan].size (); ++y)
                    {
                        memcpy (
                            cd->planarUncBufferEnd,
                            rowPtrs[chan][y],
                            scanlineSize);

                        cd->planarUncBufferEnd += scanlineSize;
                    }

                    *unknownUncompressedSize += cd->planarUncSize;
                }

                break;

            default: assert (false);
        }

        encodedChannels[chan] = true;
    }

    //
    // Pack the Unknown data into the output buffer first. Instead of
    // just copying it uncompressed, try zlib compression at least.
    //

    if (*unknownUncompressedSize > 0)
    {
        size_t outSize;
        if (EXR_ERR_SUCCESS != exr_compress_buffer(
                9, // TODO: use default??? the old call to zlib had 9 hardcoded
                _planarUncBuffer[UNKNOWN],
                *unknownUncompressedSize,
                outDataPtr,
                exr_compress_max_buffer_size (*unknownUncompressedSize),
                &outSize))
        {
            throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
        }

        outDataPtr += outSize;
        *unknownCompressedSize = outSize;
    }

    //
    // Now, pack all the Lossy DCT coefficients into our output
    // buffer, with Huffman encoding.
    //
    // Also, record the compressed size and the number of
    // uncompressed componentns we have.
    //

    if (*totalAcUncompressedCount > 0)
    {
        switch (_acCompression)
        {
            case STATIC_HUFFMAN:

                *acCompressedSize = (int) hufCompress (
                    (unsigned short*) _packedAcBuffer,
                    (int) *totalAcUncompressedCount,
                    outDataPtr);
                break;

            case DEFLATE:

            {
                size_t sourceLen = *totalAcUncompressedCount * sizeof (unsigned short);
                size_t destLen;
                if (EXR_ERR_SUCCESS != exr_compress_buffer(
                        9, // TODO: use default??? the old call to zlib had 9 hardcoded
                        _packedAcBuffer,
                        sourceLen,
                        outDataPtr,
                        exr_compress_max_buffer_size (sourceLen),
                        &destLen))
                {
                    throw IEX_NAMESPACE::InputExc (
                        "Data compression (zlib) failed.");
                }

                *acCompressedSize = destLen;
            }

            break;

            default: assert (false);
        }

        outDataPtr += *acCompressedSize;
    }

    //
    // Handle the DC components separately
    //

    if (*totalDcUncompressedCount > 0)
    {
        *dcCompressedSize = _zip->compress (
            _packedDcBuffer,
            (int) (*totalDcUncompressedCount) * sizeof (unsigned short),
            outDataPtr);

        outDataPtr += *dcCompressedSize;
    }

    //
    // If we have RLE data, first RLE encode it and set the uncompressed
    // size. Then, deflate the results and set the compressed size.
    //

    if (*rleRawSize > 0)
    {
        *rleUncompressedSize = rleCompress (
            (int) (*rleRawSize),
            _planarUncBuffer[RLE],
            (signed char*) _rleBuffer);

        size_t dstLen;
        if (EXR_ERR_SUCCESS != exr_compress_buffer(
                9, // TODO: use default??? the old call to zlib had 9 hardcoded
                _rleBuffer,
                *rleUncompressedSize,
                outDataPtr,
                exr_compress_max_buffer_size (*rleUncompressedSize),
                &dstLen))
        {
            throw IEX_NAMESPACE::BaseExc ("Error compressing RLE'd data.");
        }

        *rleCompressedSize = dstLen;
        outDataPtr += *rleCompressedSize;
    }

    //
    // Flip the counters to XDR format
    //

    for (int i = 0; i < NUM_SIZES_SINGLE; ++i)
    {
        uint64_t src = *(((uint64_t*) _outBuffer) + i);
        char*    dst = (char*) (((uint64_t*) _outBuffer) + i);

        Xdr::write<CharPtrIO> (dst, src);
    }

    //
    // We're done - compute the number of bytes we packed
    //

    outPtr = _outBuffer;

    return static_cast<int> (outDataPtr - _outBuffer);
}